

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O3

Duration *
google::protobuf::util::anon_unknown_1::CreateNormalized<google::protobuf::Duration>
          (Duration *__return_storage_ptr__,int64 seconds,int64 nanos)

{
  LogMessage *other;
  Duration *extraout_RAX;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (nanos - 1000000000U < 0xffffffff88ca6c01) {
    seconds = seconds + nanos / 1000000000;
    nanos = nanos % 1000000000;
  }
  if (nanos < 1 || -1 < seconds) {
    if (nanos < 0 && 0 < seconds) {
      seconds = seconds + -1;
      nanos = nanos + 1000000000;
    }
  }
  else {
    seconds = seconds + 1;
    nanos = nanos + -1000000000;
  }
  if (seconds - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
    protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/time_util.cc"
               ,0x62);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_68,
                       "CHECK failed: seconds >= TimeUtil::kDurationMinSeconds && seconds <= TimeUtil::kDurationMaxSeconds: "
                      );
    protobuf::internal::LogFinisher::operator=(&local_29,other);
    protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  Duration::Duration(__return_storage_ptr__,(Arena *)0x0);
  __return_storage_ptr__->seconds_ = seconds;
  __return_storage_ptr__->nanos_ = (int32)nanos;
  return extraout_RAX;
}

Assistant:

Duration CreateNormalized(int64 seconds, int64 nanos) {
  // Make sure nanos is in the range.
  if (nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    seconds += nanos / kNanosPerSecond;
    nanos = nanos % kNanosPerSecond;
  }
  // nanos should have the same sign as seconds.
  if (seconds < 0 && nanos > 0) {
    seconds += 1;
    nanos -= kNanosPerSecond;
  } else if (seconds > 0 && nanos < 0) {
    seconds -= 1;
    nanos += kNanosPerSecond;
  }
  GOOGLE_DCHECK(seconds >= TimeUtil::kDurationMinSeconds &&
         seconds <= TimeUtil::kDurationMaxSeconds);
  Duration result;
  result.set_seconds(seconds);
  result.set_nanos(static_cast<int32>(nanos));
  return result;
}